

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool __thiscall
despot::Parser::IsSelfLoopingWithoutReward(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  pointer piVar1;
  pointer pSVar2;
  pointer pSVar3;
  uint *puVar4;
  CPT *pCVar5;
  pointer pFVar6;
  bool bVar7;
  iterator iVar8;
  pointer pNVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar19;
  pair<std::_Rb_tree_iterator<std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_iterator<std::vector<int,_std::allocator<int>_>_>_>
  pVar20;
  
  this_00 = &this->selfloop_state_set_;
  iVar8 = std::
          _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::find(&this_00->_M_t,state);
  if ((_Rb_tree_header *)iVar8._M_node ==
      &(this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header) {
    piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar11 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1;
    if (lVar11 != 0) {
      lVar11 = lVar11 >> 2;
      pSVar2 = (this->prev_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar3 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0x14;
      lVar15 = 0;
      do {
        *(int *)((long)&(pSVar2->super_NamedVar).super_Variable._vptr_Variable + lVar14 * 4) =
             piVar1[lVar15];
        *(int *)((long)&(pSVar3->super_NamedVar).super_Variable._vptr_Variable + lVar14 * 4) =
             piVar1[lVar15];
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0x30;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar15);
    }
    pNVar9 = (this->action_vars_).
             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = (int)((ulong)((long)(pNVar9->super_Variable).values_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          *(long *)&(pNVar9->super_Variable).values_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data) >> 5);
    bVar7 = 0 < iVar16;
    if (0 < iVar16) {
      iVar16 = 0;
      do {
        (pNVar9->super_Variable).curr_value = iVar16;
        puVar4 = (uint *)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
        bVar17 = (uint *)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish != puVar4;
        if (bVar17) {
          pCVar5 = *(this->transition_funcs_).
                    super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (*(pCVar5->super_Function)._vptr_Function[5])(pCVar5,(ulong)*puVar4);
          if ((extraout_XMM0_Qa == 1.0) && (!NAN(extraout_XMM0_Qa))) {
            uVar13 = 1;
            do {
              piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar12 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
              bVar17 = uVar13 < uVar12;
              if (uVar12 <= uVar13) goto LAB_00155c5c;
              pCVar5 = (this->transition_funcs_).
                       super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
              (*(pCVar5->super_Function)._vptr_Function[5])(pCVar5,(ulong)(uint)piVar1[uVar13]);
              uVar13 = uVar13 + 1;
            } while ((extraout_XMM0_Qa_00 == 1.0) && (!NAN(extraout_XMM0_Qa_00)));
          }
          if (!bVar17) goto LAB_00155c5c;
LAB_00155d03:
          if (bVar7) {
            return false;
          }
          break;
        }
LAB_00155c5c:
        pFVar6 = (this->reward_funcs_).
                 super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar17 = (this->reward_funcs_).
                 super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                 super__Vector_impl_data._M_finish != pFVar6;
        if (bVar17) {
          (*pFVar6->_vptr_Function[5])(pFVar6,0);
          if ((extraout_XMM0_Qa_01 == 0.0) && (!NAN(extraout_XMM0_Qa_01))) {
            uVar13 = 0;
            lVar11 = 0x58;
            do {
              uVar13 = uVar13 + 1;
              pFVar6 = (this->reward_funcs_).
                       super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar12 = ((long)(this->reward_funcs_).
                              super__Vector_base<despot::Function,_std::allocator<despot::Function>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar6 >> 3) *
                       0x2e8ba2e8ba2e8ba3;
              bVar18 = uVar12 - uVar13 == 0;
              bVar17 = uVar12 >= uVar13 && !bVar18;
              if (uVar12 < uVar13 || bVar18) goto LAB_00155cdf;
              dVar19 = (double)(**(code **)(*(long *)((long)&pFVar6->_vptr_Function + lVar11) + 0x28
                                           ))((long)&pFVar6->_vptr_Function + lVar11);
            } while ((dVar19 == 0.0) && (lVar11 = lVar11 + 0x58, !NAN(dVar19)));
          }
          if (bVar17) goto LAB_00155d03;
        }
LAB_00155cdf:
        pNVar9 = (this->action_vars_).
                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar16 = iVar16 + 1;
        iVar10 = (int)((ulong)((long)(pNVar9->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&(pNVar9->super_Variable).values_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data) >> 5);
        bVar7 = iVar16 < iVar10;
      } while (iVar16 < iVar10);
    }
    if (this->enable_selfloop_cache_ == true) {
      if (10000 < (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pVar20 = std::
                 _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::equal_range(&this_00->_M_t,
                               (this->selfloop_state_queue_).c.
                               super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur);
        std::
        _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar20.first._M_node,
                       (_Base_ptr)pVar20.second._M_node);
        std::
        deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::pop_front(&(this->selfloop_state_queue_).c);
      }
      std::
      _Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::_M_insert_unique<std::vector<int,std::allocator<int>>const&>
                ((_Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)this_00,state);
      std::
      deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&(this->selfloop_state_queue_).c,state);
    }
  }
  return true;
}

Assistant:

bool Parser::IsSelfLoopingWithoutReward(const vector<int>& state) const {
	if (selfloop_state_set_.find(state) != selfloop_state_set_.end())
		return true;

	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
		curr_state_vars_[s].curr_value = state[s];
	}

	for (int a = 0; a < action_vars_[0].Size(); a++) {
		action_vars_[0].curr_value = a;

		for (int s = 0; s < state.size(); s++) {
			if (transition_funcs_[s]->GetValue(state[s]) != 1.0)
				return false;
		}

		for (int r = 0; r < reward_funcs_.size(); r++) {
			if (reward_funcs_[r].GetValue() != 0)
				return false;
		}
	}

	if (enable_selfloop_cache_) {
		if (selfloop_state_set_.size() > 10000) { // Replace the oldest state by the new one
			selfloop_state_set_.erase(selfloop_state_queue_.front());
			selfloop_state_queue_.pop();
		}

		selfloop_state_set_.insert(state);
		selfloop_state_queue_.push(state);
	}

	return true;
}